

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int mbedtls_x509_crt_parse_file(mbedtls_x509_crt *chain,char *path)

{
  uchar *local_38;
  uchar *buf;
  size_t n;
  char *pcStack_20;
  int ret;
  char *path_local;
  mbedtls_x509_crt *chain_local;
  
  pcStack_20 = path;
  path_local = (char *)chain;
  n._4_4_ = mbedtls_pk_load_file(path,&local_38,(size_t *)&buf);
  chain_local._4_4_ = n._4_4_;
  if (n._4_4_ == 0) {
    n._4_4_ = mbedtls_x509_crt_parse((mbedtls_x509_crt *)path_local,local_38,(size_t)buf);
    mbedtls_zeroize(local_38,(size_t)buf);
    free(local_38);
    chain_local._4_4_ = n._4_4_;
  }
  return chain_local._4_4_;
}

Assistant:

int mbedtls_x509_crt_parse_file( mbedtls_x509_crt *chain, const char *path )
{
    int ret;
    size_t n;
    unsigned char *buf;

    if( ( ret = mbedtls_pk_load_file( path, &buf, &n ) ) != 0 )
        return( ret );

    ret = mbedtls_x509_crt_parse( chain, buf, n );

    mbedtls_zeroize( buf, n );
    mbedtls_free( buf );

    return( ret );
}